

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::FunctionExpression::
ToString<duckdb::BoundAggregateExpression,duckdb::Expression,duckdb::BoundOrderModifier>
          (string *__return_storage_ptr__,FunctionExpression *this,BoundAggregateExpression *entry,
          string *catalog,string *schema,string *function_name,bool is_operator,bool distinct,
          Expression *filter,BoundOrderModifier *order_bys,bool export_state,bool add_alias)

{
  pointer *this_00;
  pointer puVar1;
  string *psVar2;
  bool bVar3;
  long lVar4;
  const_reference pvVar5;
  pointer pEVar6;
  reference this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  idx_t i;
  ulong __n;
  undefined7 in_stack_00000011;
  bool add_alias_local;
  string local_1c0;
  allocator local_19a;
  allocator local_199;
  string *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  add_alias_local = export_state;
  if ((int)function_name == 0) {
LAB_01279433:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    lVar4._0_1_ = (entry->super_Expression).super_BaseExpression.type;
    lVar4._1_1_ = (entry->super_Expression).super_BaseExpression.expression_class;
    lVar4._2_6_ = *(undefined6 *)&(entry->super_Expression).super_BaseExpression.field_0xa;
    local_198 = __return_storage_ptr__;
    if (lVar4 != 0) {
      KeywordHelper::WriteOptionallyQuoted(&local_190,(string *)entry,'\"',true);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c0,&local_190,".");
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_190);
    }
    if (catalog->_M_string_length != 0) {
      KeywordHelper::WriteOptionallyQuoted(&local_190,catalog,'\"',true);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c0,&local_190,".");
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_190);
    }
    KeywordHelper::WriteOptionallyQuoted((string *)&local_1c0,schema,'\"',true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (is_operator) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    puVar1 = this[1].children.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar4 = *(long *)&this[1].distinct;
    ::std::__cxx11::string::string((string *)&local_190,", ",(allocator *)&local_170);
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long,duckdb::FunctionExpression::ToString<duckdb::BoundAggregateExpression,duckdb::Expression,duckdb::BoundOrderModifier>(duckdb::BoundAggregateExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool,duckdb::Expression*,duckdb::BoundOrderModifier*,bool,bool)::_lambda(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>const&)_1_>
              ((string *)&local_1c0,
               (StringUtil *)
               &this[1].children.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)(lVar4 - (long)puVar1 >> 3),(unsigned_long)&local_190,(string *)&add_alias_local,
               (anon_class_8_1_29113bd2)function_name);
    ::std::__cxx11::string::append((string *)local_198);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_190);
    psVar2 = local_198;
    if ((filter != (Expression *)0x0) &&
       ((filter->super_BaseExpression).alias._M_dataplus._M_p !=
        (pointer)(filter->super_BaseExpression).alias._M_string_length)) {
      if (this[1].children.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == *(pointer *)&this[1].distinct) {
        ::std::__cxx11::string::append((char *)local_198);
      }
      ::std::__cxx11::string::append((char *)psVar2);
      for (__n = 0; __n < (ulong)((long)((filter->super_BaseExpression).alias._M_string_length -
                                        (long)(filter->super_BaseExpression).alias._M_dataplus._M_p)
                                 / 0x18); __n = __n + 1) {
        if (__n != 0) {
          ::std::__cxx11::string::append((char *)local_198);
        }
        this_01 = vector<duckdb::BoundOrderByNode,_true>::get<true>
                            ((vector<duckdb::BoundOrderByNode,_true> *)
                             &(filter->super_BaseExpression).alias,__n);
        BoundOrderByNode::ToString_abi_cxx11_((string *)&local_1c0,this_01);
        ::std::__cxx11::string::append((string *)local_198);
        ::std::__cxx11::string::~string((string *)&local_1c0);
      }
    }
    __return_storage_ptr__ = local_198;
    ::std::__cxx11::string::append((char *)local_198);
    if ((long *)CONCAT71(in_stack_00000011,distinct) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(in_stack_00000011,distinct) + 0x40))(&local_170);
      ::std::operator+(&local_190," FILTER (WHERE ",&local_170);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c0,&local_190,")");
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_190);
      ::std::__cxx11::string::~string((string *)&local_170);
    }
    if ((char)order_bys != '\0') {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    this_00 = &this[1].children.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar4 = *(long *)&this[1].distinct -
            (long)this[1].children.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3;
    if (lVar4 == 2) {
      ::std::__cxx11::string::string((string *)&local_f0,"(%s %s %s)",(allocator *)&local_1c0);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)this_00,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_110,pEVar6);
      ::std::__cxx11::string::string((string *)&local_130,(string *)schema);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)this_00,1);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_150,pEVar6);
      StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (__return_storage_ptr__,(StringUtil *)&local_f0,&local_110,&local_130,&local_150,
                 function_name);
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::__cxx11::string::~string((string *)&local_130);
      ::std::__cxx11::string::~string((string *)&local_110);
      this_02 = &local_f0;
    }
    else {
      if (lVar4 != 1) goto LAB_01279433;
      ::std::__cxx11::string::string((string *)&local_1c0,"__postfix",(allocator *)&local_190);
      bVar3 = StringUtil::Contains((string *)schema,&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      if (bVar3) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)this_00,0);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pEVar6);
        ::std::operator+(&local_170,"((",&local_50);
        ::std::operator+(&local_190,&local_170,")");
        ::std::__cxx11::string::string((string *)&local_90,(string *)schema);
        ::std::__cxx11::string::string((string *)&local_b0,"__postfix",&local_199);
        ::std::__cxx11::string::string((string *)&local_d0,anon_var_dwarf_3b2a81b + 9,&local_19a);
        StringUtil::Replace(&local_70,&local_90,&local_b0,&local_d0);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1c0,&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_70);
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1c0,")");
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_190);
        ::std::__cxx11::string::~string((string *)&local_170);
        this_02 = &local_50;
      }
      else {
        ::std::operator+(&local_190,schema,"(");
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)this_00,0);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_170,pEVar6);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1c0,&local_190,&local_170);
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1c0,")");
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_170);
        this_02 = &local_190;
      }
    }
    ::std::__cxx11::string::~string((string *)this_02);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry, const string &catalog, const string &schema, const string &function_name,
	                       bool is_operator = false, bool distinct = false, BASE *filter = nullptr,
	                       ORDER_MODIFIER *order_bys = nullptr, bool export_state = false, bool add_alias = false) {
		if (is_operator) {
			// built-in operator
			D_ASSERT(!distinct);
			if (entry.children.size() == 1) {
				if (StringUtil::Contains(function_name, "__postfix")) {
					return "((" + entry.children[0]->ToString() + ")" +
					       StringUtil::Replace(function_name, "__postfix", "") + ")";
				} else {
					return function_name + "(" + entry.children[0]->ToString() + ")";
				}
			} else if (entry.children.size() == 2) {
				return StringUtil::Format("(%s %s %s)", entry.children[0]->ToString(), function_name,
				                          entry.children[1]->ToString());
			}
		}
		// standard function call
		string result;
		if (!catalog.empty()) {
			result += KeywordHelper::WriteOptionallyQuoted(catalog) + ".";
		}
		if (!schema.empty()) {
			result += KeywordHelper::WriteOptionallyQuoted(schema) + ".";
		}
		result += KeywordHelper::WriteOptionallyQuoted(function_name);
		result += "(";
		if (distinct) {
			result += "DISTINCT ";
		}
		result += StringUtil::Join(entry.children, entry.children.size(), ", ", [&](const unique_ptr<BASE> &child) {
			return child->GetAlias().empty() || !add_alias
			           ? child->ToString()
			           : StringUtil::Format("%s := %s", SQLIdentifier(child->GetAlias()), child->ToString());
		});
		// ordered aggregate
		if (order_bys && !order_bys->orders.empty()) {
			if (entry.children.empty()) {
				result += ") WITHIN GROUP (";
			}
			result += " ORDER BY ";
			for (idx_t i = 0; i < order_bys->orders.size(); i++) {
				if (i > 0) {
					result += ", ";
				}
				result += order_bys->orders[i].ToString();
			}
		}
		result += ")";

		// filtered aggregate
		if (filter) {
			result += " FILTER (WHERE " + filter->ToString() + ")";
		}

		if (export_state) {
			result += " EXPORT_STATE";
		}

		return result;
	}